

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::BaseTriangleCase::iterate(BaseTriangleCase *this)

{
  size_type *psVar1;
  pointer pVVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  RenderTarget *pRVar10;
  pointer pSVar11;
  pointer pVVar12;
  char *description;
  IterateResult IVar13;
  pointer pVVar14;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  triangles;
  RasterizationArguments args;
  TriangleSceneSpec scene;
  string iterationDescription;
  ScopedLogSection section;
  Surface resultImage;
  undefined1 local_248 [24];
  long lStack_230;
  pointer local_228;
  pointer pSStack_220;
  pointer local_218;
  long lStack_210;
  RasterizationArguments local_208;
  undefined4 uStack_1f4;
  undefined1 local_1e8 [40];
  string local_1c0;
  ScopedLogSection local_1a0;
  Surface local_198 [4];
  ios_base local_128 [264];
  
  iVar7 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::operator<<(local_198,iVar7 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x1c103d9);
  pSVar11 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pSVar11) {
    local_218 = *(pointer *)pSVar11->positions[0].m_data;
    lStack_210 = plVar8[3];
    local_228 = (pointer)&local_218;
  }
  else {
    local_218 = *(pointer *)pSVar11->positions[0].m_data;
    local_228 = (pointer)*plVar8;
  }
  pSStack_220 = (pointer)plVar8[1];
  *plVar8 = (long)pSVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_228);
  pVVar2 = (pointer)(local_248 + 0x10);
  pVVar12 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pVVar12) {
    local_248._16_8_ = *(undefined8 *)pVVar12->m_data;
    lStack_230 = plVar8[3];
    local_248._0_8_ = pVVar2;
  }
  else {
    local_248._16_8_ = *(undefined8 *)pVVar12->m_data;
    local_248._0_8_ = (pointer)*plVar8;
  }
  local_248._8_8_ = plVar8[1];
  *plVar8 = (long)pVVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::operator<<(local_198,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  pVVar12 = (pointer)((long)(float *)local_248._8_8_ +
                     CONCAT44(local_208.greenBits,local_208.redBits));
  pVVar14 = (pointer)0xf;
  if ((pointer)local_248._0_8_ != pVVar2) {
    pVVar14 = (pointer)local_248._16_8_;
  }
  if (pVVar14 < pVVar12) {
    pVVar14 = (pointer)0xf;
    if ((int *)CONCAT44(local_208.subpixelBits,local_208.numSamples) != &local_208.blueBits) {
      pVVar14 = (pointer)CONCAT44(uStack_1f4,local_208.blueBits);
    }
    if (pVVar12 <= pVVar14) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,local_248._0_8_);
      goto LAB_00f7429b;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append
                     (local_248,CONCAT44(local_208.subpixelBits,local_208.numSamples));
LAB_00f7429b:
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1c0.field_2._M_allocated_capacity = *psVar1;
    local_1c0.field_2._8_8_ = puVar9[3];
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar1;
    local_1c0._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_1c0._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((int *)CONCAT44(local_208.subpixelBits,local_208.numSamples) != &local_208.blueBits) {
    operator_delete((undefined1 *)CONCAT44(local_208.subpixelBits,local_208.numSamples),
                    CONCAT44(uStack_1f4,local_208.blueBits) + 1);
  }
  if ((pointer)local_248._0_8_ != pVVar2) {
    operator_delete((void *)local_248._0_8_,(ulong)((long)(float *)local_248._16_8_ + 1));
  }
  if (local_228 != (pointer)&local_218) {
    operator_delete(local_228,(ulong)((long)local_218->positions[0].m_data + 1));
  }
  if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
    operator_delete((void *)local_1e8._0_8_,(ulong)((long)((Vec4 *)local_1e8._16_8_)->m_data + 1));
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1a0,
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log,&local_1c0,&local_1c0);
  iVar7 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(local_198,iVar7,iVar7);
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  local_218 = (pointer)0x0;
  local_228 = (pointer)0x0;
  pSStack_220 = (pointer)0x0;
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)(uint)this->m_iteration);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,local_198,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_248,
             this->m_primitiveDrawType);
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8._8_8_ = (pointer)0x0;
  local_1e8._16_8_ = (pointer)0x0;
  local_208.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_208.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  pRVar10 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_208.redBits = (pRVar10->m_pixelFormat).redBits;
  pRVar10 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_208.greenBits = (pRVar10->m_pixelFormat).greenBits;
  pRVar10 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  uVar5 = local_1e8._16_8_;
  uVar4 = local_1e8._8_8_;
  uVar3 = local_1e8._0_8_;
  local_208.blueBits = (pRVar10->m_pixelFormat).blueBits;
  local_1e8._0_8_ = local_228;
  local_1e8._8_8_ = pSStack_220;
  local_1e8._16_8_ = local_218;
  local_228 = (pointer)uVar3;
  pSStack_220 = (pointer)uVar4;
  local_218 = (pointer)uVar5;
  bVar6 = tcu::verifyTriangleGroupRasterization
                    (local_198,(TriangleSceneSpec *)local_1e8,&local_208,
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log,VERIFICATIONMODE_STRICT);
  if (!bVar6) {
    this->m_allIterationsPassed = false;
  }
  if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ - local_1e8._0_8_);
  }
  iVar7 = this->m_iteration + 1;
  this->m_iteration = iVar7;
  IVar13 = CONTINUE;
  if (iVar7 == this->m_iterationCount) {
    description = "Incorrect rasterization";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar13 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  if (local_228 != (pointer)0x0) {
    operator_delete(local_228,(long)local_218 - (long)local_228);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  tcu::Surface::~Surface(local_198);
  tcu::TestLog::endSection(local_1a0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  return IVar13;
}

Assistant:

BaseTriangleCase::IterateResult BaseTriangleCase::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	generateTriangles(m_iteration, drawBuffer, triangles);

	// draw image
	drawPrimitives(resultImage, drawBuffer, m_primitiveDrawType);

	// compare
	{
		bool					compareOk;
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		compareOk = verifyTriangleGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

		if (!compareOk)
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}